

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleUploadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  CURLcode CVar2;
  long lVar3;
  FILE *__stream;
  unsigned_long uVar4;
  CURL *curl;
  ostream *poVar5;
  char *pcVar6;
  byte bVar7;
  pointer pbVar8;
  cURLProgressHelper helper;
  long local_288;
  cURLEasyGuard g_curl;
  cmFileCommandVectorOfChar chunkDebug;
  allocator local_260;
  undefined7 uStack_25f;
  string errStr;
  cmFileCommandVectorOfChar chunkResponse;
  string logVar;
  string statusVar;
  string filename;
  string url;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
    std::__cxx11::string::string
              ((string *)&errStr,"UPLOAD must be called with at least three arguments.",
               (allocator *)&helper);
    cmCommand::SetError(&this->super_cmCommand,&errStr);
    std::__cxx11::string::~string((string *)&errStr);
    return false;
  }
  std::__cxx11::string::string((string *)&filename,(string *)(pbVar8 + 1));
  std::__cxx11::string::string((string *)&url,(string *)(pbVar8 + 2));
  logVar._M_dataplus._M_p = (pointer)&logVar.field_2;
  logVar._M_string_length = 0;
  statusVar._M_dataplus._M_p = (pointer)&statusVar.field_2;
  statusVar._M_string_length = 0;
  lVar3 = 0;
  logVar.field_2._M_local_buf[0] = '\0';
  statusVar.field_2._M_local_buf[0] = '\0';
  local_288 = 0;
  bVar7 = 0;
  for (pbVar8 = pbVar8 + 3;
      pbVar8 != (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
    bVar1 = std::operator==(pbVar8,"TIMEOUT");
    if (bVar1) {
      pbVar8 = pbVar8 + 1;
      if (pbVar8 == (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string
                  ((string *)&errStr,"UPLOAD missing time for TIMEOUT.",(allocator *)&helper);
        cmCommand::SetError(&this->super_cmCommand,&errStr);
        goto LAB_002a12c9;
      }
      lVar3 = atol((pbVar8->_M_dataplus)._M_p);
    }
    else {
      bVar1 = std::operator==(pbVar8,"INACTIVITY_TIMEOUT");
      if (bVar1) {
        pbVar8 = pbVar8 + 1;
        if (pbVar8 == (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string
                    ((string *)&errStr,"UPLOAD missing time for INACTIVITY_TIMEOUT.",
                     (allocator *)&helper);
          cmCommand::SetError(&this->super_cmCommand,&errStr);
          goto LAB_002a12c9;
        }
        local_288 = atol((pbVar8->_M_dataplus)._M_p);
      }
      else {
        bVar1 = std::operator==(pbVar8,"LOG");
        if (bVar1) {
          pbVar8 = pbVar8 + 1;
          if (pbVar8 == (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string
                      ((string *)&errStr,"UPLOAD missing VAR for LOG.",(allocator *)&helper);
            cmCommand::SetError(&this->super_cmCommand,&errStr);
            goto LAB_002a12c9;
          }
          std::__cxx11::string::_M_assign((string *)&logVar);
        }
        else {
          bVar1 = std::operator==(pbVar8,"STATUS");
          if (bVar1) {
            pbVar8 = pbVar8 + 1;
            if (pbVar8 == (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string
                        ((string *)&errStr,"UPLOAD missing VAR for STATUS.",(allocator *)&helper);
              cmCommand::SetError(&this->super_cmCommand,&errStr);
              goto LAB_002a12c9;
            }
            std::__cxx11::string::_M_assign((string *)&statusVar);
          }
          else {
            bVar1 = std::operator==(pbVar8,"SHOW_PROGRESS");
            bVar7 = bVar7 | bVar1;
          }
        }
      }
    }
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&filename,"rb");
  if (__stream == (FILE *)0x0) {
    std::__cxx11::string::string
              ((string *)&errStr,"UPLOAD cannot open file \'",(allocator *)&helper);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&helper,
                   &filename,"\' for reading.");
    std::__cxx11::string::append((string *)&errStr);
    std::__cxx11::string::~string((string *)&helper);
    cmCommand::SetError(&this->super_cmCommand,&errStr);
LAB_002a12c9:
    std::__cxx11::string::~string((string *)&errStr);
  }
  else {
    uVar4 = cmsys::SystemTools::FileLength(&filename);
    curl_global_init(3);
    curl = curl_easy_init();
    if (curl != (CURL *)0x0) {
      g_curl.Easy = curl;
      CVar2 = curl_easy_setopt(curl,CURLOPT_FAILONERROR,1);
      if (CVar2 == CURLE_OK) {
        CVar2 = curl_easy_setopt(curl,CURLOPT_UPLOAD,1);
        if (CVar2 != CURLE_OK) {
          std::__cxx11::string::string
                    ((string *)&errStr,"UPLOAD cannot set upload flag: ",(allocator *)&helper);
          curl_easy_strerror(CVar2);
          std::__cxx11::string::append((char *)&errStr);
          cmCommand::SetError(&this->super_cmCommand,&errStr);
          goto LAB_002a1400;
        }
        CVar2 = curl_easy_setopt(curl,CURLOPT_URL,url._M_dataplus._M_p);
        if (CVar2 != CURLE_OK) {
          std::__cxx11::string::string
                    ((string *)&errStr,"UPLOAD cannot set url: ",(allocator *)&helper);
          curl_easy_strerror(CVar2);
          std::__cxx11::string::append((char *)&errStr);
          cmCommand::SetError(&this->super_cmCommand,&errStr);
          goto LAB_002a1400;
        }
        CVar2 = curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_19525f::cmWriteToMemoryCallback);
        if (CVar2 != CURLE_OK) {
          std::__cxx11::string::string
                    ((string *)&errStr,"UPLOAD cannot set write function: ",(allocator *)&helper);
          curl_easy_strerror(CVar2);
          std::__cxx11::string::append((char *)&errStr);
          cmCommand::SetError(&this->super_cmCommand,&errStr);
          goto LAB_002a1400;
        }
        CVar2 = curl_easy_setopt(curl,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_19525f::cmFileCommandCurlDebugCallback);
        if (CVar2 != CURLE_OK) {
          std::__cxx11::string::string
                    ((string *)&errStr,"UPLOAD cannot set debug function: ",(allocator *)&helper);
          curl_easy_strerror(CVar2);
          std::__cxx11::string::append((char *)&errStr);
          cmCommand::SetError(&this->super_cmCommand,&errStr);
          goto LAB_002a1400;
        }
        chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        CVar2 = curl_easy_setopt(curl,CURLOPT_WRITEDATA);
        if (CVar2 == CURLE_OK) {
          CVar2 = curl_easy_setopt(curl,CURLOPT_DEBUGDATA,&chunkDebug);
          if (CVar2 != CURLE_OK) {
            std::__cxx11::string::string
                      ((string *)&errStr,"UPLOAD cannot set debug data: ",(allocator *)&helper);
            curl_easy_strerror(CVar2);
            std::__cxx11::string::append((char *)&errStr);
            cmCommand::SetError(&this->super_cmCommand,&errStr);
            goto LAB_002a158e;
          }
          CVar2 = curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1);
          if (CVar2 != CURLE_OK) {
            std::__cxx11::string::string
                      ((string *)&errStr,"UPLOAD cannot set follow-redirect option: ",
                       (allocator *)&helper);
            curl_easy_strerror(CVar2);
            std::__cxx11::string::append((char *)&errStr);
            cmCommand::SetError(&this->super_cmCommand,&errStr);
            goto LAB_002a158e;
          }
          if ((logVar._M_string_length != 0) &&
             (CVar2 = curl_easy_setopt(curl,CURLOPT_VERBOSE,1), CVar2 != CURLE_OK)) {
            std::__cxx11::string::string
                      ((string *)&errStr,"UPLOAD cannot set verbose: ",(allocator *)&helper);
            curl_easy_strerror(CVar2);
            std::__cxx11::string::append((char *)&errStr);
            cmCommand::SetError(&this->super_cmCommand,&errStr);
            goto LAB_002a158e;
          }
          if ((0 < lVar3) &&
             (CVar2 = curl_easy_setopt(curl,CURLOPT_TIMEOUT,lVar3), CVar2 != CURLE_OK)) {
            std::__cxx11::string::string
                      ((string *)&errStr,"UPLOAD cannot set timeout: ",(allocator *)&helper);
            curl_easy_strerror(CVar2);
            std::__cxx11::string::append((char *)&errStr);
            cmCommand::SetError(&this->super_cmCommand,&errStr);
            goto LAB_002a158e;
          }
          if (0 < local_288) {
            curl_easy_setopt(curl,CURLOPT_LOW_SPEED_LIMIT,1);
            curl_easy_setopt(curl,CURLOPT_LOW_SPEED_TIME,local_288);
          }
          anon_unknown.dwarf_19525f::cURLProgressHelper::cURLProgressHelper(&helper,this,"upload");
          if (bVar7 == 0) {
LAB_002a17e8:
            CVar2 = curl_easy_setopt(curl,CURLOPT_READDATA,__stream);
            if (CVar2 != CURLE_OK) {
              std::__cxx11::string::string
                        ((string *)&errStr,"UPLOAD cannot set input file: ",&local_260);
              curl_easy_strerror(CVar2);
              std::__cxx11::string::append((char *)&errStr);
              cmCommand::SetError(&this->super_cmCommand,&errStr);
              goto LAB_002a189a;
            }
            CVar2 = curl_easy_setopt(curl,CURLOPT_INFILESIZE,uVar4);
            if (CVar2 != CURLE_OK) {
              std::__cxx11::string::string
                        ((string *)&errStr,"UPLOAD cannot set input file size: ",&local_260);
              curl_easy_strerror(CVar2);
              std::__cxx11::string::append((char *)&errStr);
              cmCommand::SetError(&this->super_cmCommand,&errStr);
              goto LAB_002a189a;
            }
            CVar2 = curl_easy_perform(curl);
            g_curl.Easy = (CURL *)0x0;
            curl_easy_cleanup(curl);
            if (statusVar._M_string_length != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&errStr);
              poVar5 = (ostream *)std::ostream::operator<<(&errStr,CVar2);
              poVar5 = std::operator<<(poVar5,";\"");
              pcVar6 = curl_easy_strerror(CVar2);
              poVar5 = std::operator<<(poVar5,pcVar6);
              std::operator<<(poVar5,"\"");
              this_00 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::AddDefinition(this_00,&statusVar,(char *)CONCAT71(uStack_25f,local_260));
              std::__cxx11::string::~string((string *)&local_260);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errStr);
            }
            curl_global_cleanup();
            fclose(__stream);
            bVar1 = true;
            if (logVar._M_string_length != 0) {
              errStr._M_dataplus._M_p = (pointer)&errStr.field_2;
              errStr._M_string_length = 0;
              errStr.field_2._M_local_buf[0] = '\0';
              if (chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_260 = (allocator)0x0;
                std::vector<char,_std::allocator<char>_>::emplace_back<char>
                          (&chunkResponse,(char *)&local_260);
                std::__cxx11::string::append((char *)&errStr);
                std::__cxx11::string::append((char *)&errStr);
                std::__cxx11::string::append((char *)&errStr);
              }
              if (chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_260 = (allocator)0x0;
                std::vector<char,_std::allocator<char>_>::emplace_back<char>
                          (&chunkDebug,(char *)&local_260);
                std::__cxx11::string::append((char *)&errStr);
                std::__cxx11::string::append((char *)&errStr);
                std::__cxx11::string::append((char *)&errStr);
              }
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&logVar,errStr._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&errStr);
            }
          }
          else {
            CVar2 = curl_easy_setopt(curl,CURLOPT_NOPROGRESS,0);
            if (CVar2 == CURLE_OK) {
              CVar2 = curl_easy_setopt(curl,CURLOPT_PROGRESSFUNCTION,
                                       anon_unknown.dwarf_19525f::cmFileUploadProgressCallback);
              if (CVar2 == CURLE_OK) {
                CVar2 = curl_easy_setopt(curl,CURLOPT_PROGRESSDATA,&helper);
                if (CVar2 == CURLE_OK) goto LAB_002a17e8;
                std::__cxx11::string::string
                          ((string *)&errStr,"UPLOAD cannot set progress data: ",&local_260);
                curl_easy_strerror(CVar2);
                std::__cxx11::string::append((char *)&errStr);
                cmCommand::SetError(&this->super_cmCommand,&errStr);
              }
              else {
                std::__cxx11::string::string
                          ((string *)&errStr,"UPLOAD cannot set progress function: ",&local_260);
                curl_easy_strerror(CVar2);
                std::__cxx11::string::append((char *)&errStr);
                cmCommand::SetError(&this->super_cmCommand,&errStr);
              }
            }
            else {
              std::__cxx11::string::string
                        ((string *)&errStr,"UPLOAD cannot set noprogress value: ",&local_260);
              curl_easy_strerror(CVar2);
              std::__cxx11::string::append((char *)&errStr);
              cmCommand::SetError(&this->super_cmCommand,&errStr);
            }
LAB_002a189a:
            std::__cxx11::string::~string((string *)&errStr);
            bVar1 = false;
          }
          std::__cxx11::string::~string((string *)&helper.Text);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&errStr,"UPLOAD cannot set write data: ",(allocator *)&helper);
          curl_easy_strerror(CVar2);
          std::__cxx11::string::append((char *)&errStr);
          cmCommand::SetError(&this->super_cmCommand,&errStr);
LAB_002a158e:
          std::__cxx11::string::~string((string *)&errStr);
          bVar1 = false;
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&chunkResponse.super__Vector_base<char,_std::allocator<char>_>);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&errStr,"UPLOAD cannot set fail on error flag: ",(allocator *)&helper);
        curl_easy_strerror(CVar2);
        std::__cxx11::string::append((char *)&errStr);
        cmCommand::SetError(&this->super_cmCommand,&errStr);
LAB_002a1400:
        std::__cxx11::string::~string((string *)&errStr);
        bVar1 = false;
      }
      anon_unknown.dwarf_19525f::cURLEasyGuard::~cURLEasyGuard(&g_curl);
      goto LAB_002a1419;
    }
    std::__cxx11::string::string
              ((string *)&errStr,"UPLOAD error initializing curl.",(allocator *)&helper);
    cmCommand::SetError(&this->super_cmCommand,&errStr);
    std::__cxx11::string::~string((string *)&errStr);
    fclose(__stream);
  }
  bVar1 = false;
LAB_002a1419:
  std::__cxx11::string::~string((string *)&statusVar);
  std::__cxx11::string::~string((string *)&logVar);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&filename);
  return bVar1;
}

Assistant:

bool
cmFileCommand::HandleUploadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if(args.size() < 3)
    {
    this->SetError("UPLOAD must be called with at least three arguments.");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }

    ++i;
    }

  // Open file for reading:
  //
  FILE *fin = cmsys::SystemTools::Fopen(filename, "rb");
  if(!fin)
    {
    std::string errStr = "UPLOAD cannot open file '";
    errStr += filename + "' for reading.";
    this->SetError(errStr);
    return false;
    }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
    }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "UPLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "upload");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
    }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res = ::curl_easy_setopt(curl,
    CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  fclose(fin);
  fin = NULL;

  if(!logVar.empty())
    {
    std::string log;

    if(!chunkResponse.empty())
      {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += &*chunkResponse.begin();
      log += "\n";
      }

    if(!chunkDebug.empty())
      {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += &*chunkDebug.begin();
      log += "\n";
      }

    this->Makefile->AddDefinition(logVar, log.c_str());
    }

  return true;
#else
  this->SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}